

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_anomaly_test.cc
# Opt level: O1

void write_failure_test(void)

{
  size_t keylen;
  void *pvVar1;
  void *pvVar2;
  long lVar3;
  char *pcVar4;
  fdb_status fVar5;
  int iVar6;
  anomalous_callbacks *cbs;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  int *piVar10;
  fdb_kvs_handle *pfVar11;
  undefined8 uVar12;
  undefined4 extraout_EDX;
  long lVar13;
  long *__s2;
  long *plVar14;
  char *pcVar15;
  fdb_doc *pfVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  fdb_doc **ppfVar19;
  fdb_doc **doc;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  size_t asStack_c040 [2];
  ulong uStack_c030;
  fdb_doc *local_c028 [6001];
  undefined1 local_4a0 [8];
  fdb_config fconfig;
  char metabuf [256];
  char bodybuf [256];
  char temp [256];
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fail_ctx_t fail_ctx;
  fdb_file_handle *local_58;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  char *local_40;
  fdb_doc *local_38;
  fdb_doc *rdoc;
  
  uStack_c030 = 0x106d51;
  gettimeofday((timeval *)&kvs_config.custom_cmp_param,(__timezone_ptr_t)0x0);
  uStack_c030 = 0x106d56;
  memleak_start();
  uStack_c030 = 0x106d5b;
  cbs = get_default_anon_cbs();
  __test_begin.tv_usec = 0;
  cbs->pwrite_cb = pwrite_failure_cb;
  uStack_c030 = 0x106d80;
  system("rm -rf  anomaly_test* > errorlog.txt");
  uStack_c030 = 0x106d8b;
  filemgr_ops_anomalous_init(cbs,&__test_begin.tv_usec);
  uStack_c030 = 0x106da2;
  fdb_get_default_config();
  uStack_c030 = 0x106db1;
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.purging_interval = 1;
  fconfig.wal_threshold._4_4_ = 0;
  fconfig.flags._3_1_ = 0;
  lVar3 = -((long)(int)(local_4a0._4_4_ - 0x100) + 0xfU & 0xfffffffffffffff0);
  pcVar15 = (char *)((long)local_c028 + lVar3);
  *(undefined8 *)((long)local_c028 + lVar3 + -8) = 0x106dfa;
  fdb_open(&local_58,"anomaly_test1",(fdb_config *)local_4a0);
  *(undefined8 *)((long)local_c028 + lVar3 + -8) = 0x106e0a;
  fdb_kvs_open_default(local_58,(fdb_kvs_handle **)&dbfile,(fdb_kvs_config *)(temp + 0xf8));
  uVar20 = local_4a0._4_4_ - 0x101;
  if (0 < (int)uVar20) {
    *(undefined8 *)((long)local_c028 + lVar3 + -8) = 0x106e26;
    memset(pcVar15,0x5f,(ulong)uVar20);
  }
  pcVar15[(int)uVar20] = '\0';
  ppfVar19 = local_c028;
  pfVar11 = (fdb_kvs_handle *)0x0;
  lVar13 = 0;
  local_40 = pcVar15;
  do {
    pcVar4 = local_40;
    *(undefined8 *)((long)local_c028 + lVar3 + -8) = 0x106e67;
    db = pfVar11;
    sprintf(bodybuf + 0xf8,"%08d");
    *(undefined8 *)pcVar4 = bodybuf._248_8_;
    uVar22 = 0;
    doc = ppfVar19;
    do {
      *(undefined8 *)((long)local_c028 + lVar3 + -8) = 0x106e93;
      sprintf(bodybuf + 0xf8,"%08d",uVar22 & 0xffffffff);
      *(undefined8 *)((long)local_c028 + (int)uVar20 + lVar3 + -8) = bodybuf._248_8_;
      uVar21 = (int)db + (int)uVar22;
      *(undefined8 *)((long)local_c028 + lVar3 + -8) = 0x106ec3;
      sprintf((char *)&fconfig.num_blocks_readahead,"meta%d",(ulong)uVar21);
      *(undefined8 *)((long)local_c028 + lVar3 + -8) = 0x106ed7;
      sprintf(metabuf + 0xf8,"body%d",(ulong)uVar21);
      *(undefined8 *)((long)local_c028 + lVar3 + -8) = 0x106edf;
      sVar7 = strlen(pcVar15);
      *(undefined8 *)((long)local_c028 + lVar3 + -8) = 0x106eef;
      sVar8 = strlen((char *)&fconfig.num_blocks_readahead);
      *(undefined8 *)((long)local_c028 + lVar3 + -8) = 0x106eff;
      sVar9 = strlen(metabuf + 0xf8);
      *(size_t *)((long)asStack_c040 + lVar3 + 8) = sVar9 + 1;
      *(undefined8 *)((long)asStack_c040 + lVar3) = 0x106f30;
      fdb_doc_create(doc,pcVar15,sVar7 + 1,&fconfig.num_blocks_readahead,sVar8 + 1,metabuf + 0xf8,
                     *(size_t *)((long)asStack_c040 + lVar3 + 8));
      uVar22 = uVar22 + 1;
      doc = doc + 1;
    } while (uVar22 != 0x14);
    lVar13 = lVar13 + 1;
    ppfVar19 = ppfVar19 + 0x14;
    pfVar11 = (fdb_kvs_handle *)((long)&(db->kvs_config).custom_cmp_param + 4);
  } while (lVar13 != 300);
  lVar13 = 0;
  do {
    pfVar16 = local_c028[lVar13];
    *(undefined8 *)((long)local_c028 + lVar3 + -8) = 0x106f8a;
    fdb_set((fdb_kvs_handle *)dbfile,pfVar16);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 6000);
  *(undefined8 *)((long)local_c028 + lVar3 + -8) = 0x106fa4;
  fdb_commit(local_58,'\x01');
  lVar13 = 0;
  do {
    keylen = **(size_t **)((long)local_c028 + lVar13);
    pvVar1 = (void *)(*(size_t **)((long)local_c028 + lVar13))[4];
    uVar12 = 0;
    uVar17 = 0;
    uVar18 = 0;
    *(undefined8 *)((long)asStack_c040 + lVar3 + 8) = 0;
    *(undefined8 *)((long)asStack_c040 + lVar3) = 0x106fd0;
    fdb_doc_create(&local_38,pvVar1,keylen,(void *)0x0,0,(void *)0x0,
                   *(size_t *)((long)asStack_c040 + lVar3 + 8));
    *(undefined8 *)((long)local_c028 + lVar3 + -8) = 0x106fe1;
    fVar5 = fdb_get((fdb_kvs_handle *)dbfile,local_38);
    if (fVar5 != FDB_RESULT_SUCCESS) {
      *(undefined8 *)((long)local_c028 + lVar3 + -8) = 0x107092;
      fdb_doc_free(local_38);
      *(undefined8 *)((long)local_c028 + lVar3 + -8) = 0x10709b;
      fdb_close(local_58);
      lVar13 = 0;
      do {
        pfVar16 = local_c028[lVar13];
        *(undefined8 *)((long)local_c028 + lVar3 + -8) = 0x1070aa;
        fdb_doc_free(pfVar16);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 6000);
      *(undefined8 *)((long)local_c028 + lVar3 + -8) = 0x1070bb;
      fdb_shutdown();
      *(undefined8 *)((long)local_c028 + lVar3 + -8) = 0x1070c0;
      memleak_end();
      *(undefined8 *)((long)local_c028 + lVar3 + -8) = 0x1070de;
      sprintf(bodybuf + 0xf8,"write failure test: %d failures out of %d writes",
              __test_begin.tv_usec & 0xffffffff,(ulong)__test_begin.tv_usec >> 0x20);
      pcVar15 = "%s PASSED\n";
      if (write_failure_test()::__test_pass != '\0') {
        pcVar15 = "%s FAILED\n";
      }
      *(undefined8 *)((long)local_c028 + lVar3 + -8) = 0x10710b;
      fprintf(_stderr,pcVar15,bodybuf + 0xf8);
      return;
    }
    plVar14 = (long *)((long)local_c028 + lVar13);
    sVar7 = local_38->keylen;
    pvVar1 = local_38->key;
    pvVar2 = *(void **)(*plVar14 + 0x20);
    *(undefined8 *)((long)local_c028 + lVar3 + -8) = 0x10700b;
    iVar6 = bcmp(pvVar1,pvVar2,sVar7);
    if (iVar6 != 0) {
      *(undefined8 *)((long)local_c028 + lVar3 + -8) = 0x107071;
      write_failure_test();
    }
    sVar7 = local_38->metalen;
    pvVar1 = local_38->meta;
    pvVar2 = *(void **)(*plVar14 + 0x38);
    *(undefined8 *)((long)local_c028 + lVar3 + -8) = 0x107027;
    iVar6 = bcmp(pvVar1,pvVar2,sVar7);
    if (iVar6 != 0) {
      *(undefined8 *)((long)local_c028 + lVar3 + -8) = 0x10707e;
      write_failure_test();
    }
    sVar7 = local_38->bodylen;
    pvVar1 = local_38->body;
    __s2 = *(long **)(*plVar14 + 0x40);
    *(undefined8 *)((long)local_c028 + lVar3 + -8) = 0x107043;
    iVar6 = bcmp(pvVar1,__s2,sVar7);
    if (iVar6 != 0) {
      *(undefined8 *)((long)local_c028 + lVar3 + -8) = 0x10708b;
      write_failure_test();
      __s2 = plVar14;
    }
    *(undefined8 *)((long)local_c028 + lVar3 + -8) = 0x107050;
    pfVar16 = local_38;
    fdb_doc_free(local_38);
    lVar13 = lVar13 + 8;
  } while (lVar13 != 48000);
  *(code **)((long)local_c028 + lVar3 + -8) = pread_failure_cb;
  write_failure_test();
  uVar20 = *(uint *)((long)&pfVar16->keylen + 4);
  *(uint *)((long)&pfVar16->keylen + 4) = uVar20 + 1;
  if ((int)uVar20 < (int)pfVar16->metalen) {
    (*(code *)__s2[2])(extraout_EDX,uVar12,uVar17,uVar18);
    return;
  }
  *(ulong *)((long)local_c028 + lVar3 + -8) = (ulong)uVar20;
  *(int *)&pfVar16->keylen = (int)pfVar16->keylen + 1;
  *(undefined8 *)((long)asStack_c040 + lVar3 + 8) = 0x107148;
  piVar10 = __errno_location();
  *piVar10 = -2;
  return;
}

Assistant:

void write_failure_test()
{
    TEST_INIT();

    memleak_start();

    int i, j, idx, r;
    int n=300, m=20; // n: # prefixes, m: # postfixes
    int keylen_limit;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n*m);
    fdb_doc *rdoc;
    fdb_status status;
    int anomaly_hit = 0;

    char *keybuf;
    char metabuf[256], bodybuf[256], temp[256];
    // Get the default callbacks which result in normal operation for other ops
    struct anomalous_callbacks *write_fail_cb = get_default_anon_cbs();
    fail_ctx_t fail_ctx;
    memset(&fail_ctx, 0, sizeof(fail_ctx_t));
    // Modify the pwrite callback to redirect to test-specific function
    write_fail_cb->pwrite_cb = &pwrite_failure_cb;

    // remove previous anomaly_test files
    r = system(SHELL_DEL" anomaly_test* > errorlog.txt");
    (void)r;

    // Reset anomalous behavior stats..
    filemgr_ops_anomalous_init(write_fail_cb, &fail_ctx);

    // The number indicates the count after which all writes begin to fail
    // This number is unique to this test suite and can cause a segmentation
    // fault if the underlying fixed issue resurfaces
    fail_ctx.start_failing_after = 10112;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;

    keylen_limit = fconfig.blocksize - 256;
    keybuf = alca(char, keylen_limit);

    // open db
    fdb_open(&dbfile, "anomaly_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    // key structure:
    // <------------ <keylen_limit> bytes ------------->
    // <-- 8 bytes -->             <-- 8 bytes  -->< 1 >
    // [prefix number]____ ... ____[postfix number][ \0]
    // e.g.)
    // 00000001____ ... ____00000013[\0]

    // create docs
    for (i=0;i<keylen_limit-1;++i){
        keybuf[i] = '_';
    }
    keybuf[keylen_limit-1] = 0;

    for (i=0;i<n;++i){
        // set prefix
        sprintf(temp, "%08d", i);
        memcpy(keybuf, temp, 8);
        for (j=0;j<m;++j){
            idx = i*m + j;
            // set postfix
            sprintf(temp, "%08d", j);
            memcpy(keybuf + (keylen_limit-1) - 8, temp, 8);
            sprintf(metabuf, "meta%d", idx);
            sprintf(bodybuf, "body%d", idx);
            fdb_doc_create(&doc[idx], (void*)keybuf, strlen(keybuf)+1,
                                    (void*)metabuf, strlen(metabuf)+1,
                                    (void*)bodybuf, strlen(bodybuf)+1);
        }
    }

    // insert docs
    for (i=0;i<n*m;++i) {
        fdb_set(db, doc[i]);
    }
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // retrieval check
    for (i=0;i<n*m;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        if (status != FDB_RESULT_SUCCESS) {
            fdb_doc_free(rdoc);
            anomaly_hit = 1;
            break;
        }
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(!memcmp(rdoc->key, doc[i]->key, rdoc->keylen));
        TEST_CHK(!memcmp(rdoc->meta, doc[i]->meta, rdoc->metalen));
        TEST_CHK(!memcmp(rdoc->body, doc[i]->body, rdoc->bodylen));
        fdb_doc_free(rdoc);
    }
    TEST_CHK(anomaly_hit);

    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n*m;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(temp, "write failure test: %d failures out of %d writes",
            fail_ctx.num_fails, fail_ctx.num_ops);

    TEST_RESULT(temp);
}